

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void rtosc::path_search(Ports *root,char *str,char *needle,char *types,size_t max_types,
                       rtosc_arg_t *args,size_t max_args,path_search_opts opts,bool reply_with_query
                       )

{
  pointer pPVar1;
  char *pcVar2;
  char *__s2;
  long lVar3;
  rtosc_arg_t *prVar4;
  ulong uVar5;
  int iVar6;
  Port *pPVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  my_array<rtosc_arg_t,_2UL> *__i;
  size_t sVar10;
  rtosc_arg_t *prVar11;
  Port *p_00;
  ulong uVar12;
  Port *p;
  pointer p_01;
  long lVar13;
  size_t local_b0;
  rtosc_arg_t *args_local;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  ulong local_78;
  char *types_local;
  char *needle_local;
  size_t max;
  anon_class_40_5_2428ddf5 fn;
  
  needle_local = needle;
  if (needle == (char *)0x0) {
    needle_local = "";
  }
  pcVar2 = needle_local;
  uVar8 = max_types - 1;
  if (max_args <= max_types - 1) {
    uVar8 = max_args;
  }
  local_b0 = 0;
  args_local = args;
  types_local = types;
  max = uVar8;
  memset(types,0,uVar8 + 1);
  memset(args,0,uVar8);
  if (reply_with_query) {
    *types = 's';
    args->s = str;
    types[1] = 's';
    local_b0 = 2;
    args[1].s = pcVar2;
  }
  if ((*str == '\0') || ((*str == '/' && (str[1] == '\0')))) {
    p_00 = (Port *)0x0;
  }
  else {
    pPVar7 = Ports::apropos(root,str);
    if (pPVar7 == (Port *)0x0) {
      root = (Ports *)0x0;
      p_00 = (Port *)0x0;
    }
    else {
      root = pPVar7->ports;
      p_00 = (Port *)0x0;
      if (root == (Ports *)0x0) {
        p_00 = pPVar7;
      }
    }
  }
  fn.pos = &local_b0;
  fn.needle = &needle_local;
  fn.types = &types_local;
  fn.args = &args_local;
  fn.max = &max;
  if (root == (Ports *)0x0) {
    if (p_00 != (Port *)0x0) {
      path_search::anon_class_40_5_2428ddf5::operator()(&fn,p_00);
    }
  }
  else {
    pPVar1 = (root->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (p_01 = (root->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_start; p_01 != pPVar1; p_01 = p_01 + 1) {
      path_search::anon_class_40_5_2428ddf5::operator()(&fn,p_01);
    }
  }
  prVar4 = args_local;
  if (opts - sorted < 2) {
    local_a0 = local_b0 >> 1;
    uVar8 = local_a0 * 0x20;
    local_98 = local_b0;
    local_88 = uVar8;
    if (1 < local_b0) {
      prVar11 = args_local + local_a0 * 2;
      lVar13 = 0x3f;
      if (local_a0 != 0) {
        for (; local_a0 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<my_array<rtosc_arg_t,2ul>*,long,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                (args_local,prVar11,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      if (uVar8 < 0x201) {
        std::
        __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                  (prVar4,prVar11);
      }
      else {
        prVar11 = prVar4 + 0x20;
        std::
        __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                  (prVar4,prVar11);
        for (lVar13 = uVar8 - 0x200; lVar13 != 0; lVar13 = lVar13 + -0x20) {
          std::
          __unguarded_linear_insert<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Val_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>>
                    (prVar11);
          prVar11 = prVar11 + 2;
        }
      }
    }
    if (opts == sorted_and_unique_prefix) {
      if (local_98 < 4) {
        __n = 0;
      }
      else {
        __n = strlen(args_local->s);
      }
      uVar12 = local_98 & 0xfffffffffffffffe;
      local_80 = 0;
      uVar9 = 0;
      uVar8 = 2;
      local_90 = uVar12;
      while (uVar5 = local_88, prVar4 = args_local, local_b0 = uVar8, uVar8 < uVar12) {
        pcVar2 = args_local[uVar8].s;
        local_78 = uVar9;
        uVar9 = strlen(pcVar2);
        sVar10 = uVar8;
        if (__n < uVar9) {
          __s2 = prVar4[local_78].s;
          iVar6 = strncmp(pcVar2,__s2,__n);
          uVar12 = local_90;
          if ((iVar6 == 0) && (__s2[__n - 1] == '/')) {
            prVar4[uVar8].d = 0.0;
            local_80 = local_80 + 1;
            uVar9 = __n;
            uVar8 = local_78;
            sVar10 = local_b0;
          }
        }
        __n = uVar9;
        uVar9 = uVar8;
        uVar8 = sVar10 + 2;
      }
      if (1 < local_98) {
        lVar13 = (long)args_local + local_88;
        lVar3 = 0x3f;
        if (local_a0 != 0) {
          for (; local_a0 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<my_array<rtosc_arg_t,2ul>*,long,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                  (args_local,lVar13,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if (uVar5 < 0x201) {
          std::
          __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                    (prVar4,lVar13);
        }
        else {
          prVar11 = prVar4 + 0x20;
          std::
          __insertion_sort<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Iter_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                    (prVar4,prVar11);
          for (lVar13 = uVar5 - 0x200; lVar13 != 0; lVar13 = lVar13 + -0x20) {
            std::
            __unguarded_linear_insert<my_array<rtosc_arg_t,2ul>*,__gnu_cxx::__ops::_Val_comp_iter<rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>>
                      (prVar11);
            prVar11 = prVar11 + 2;
          }
        }
      }
      types_local[(local_a0 - local_80) * 2] = '\0';
    }
  }
  return;
}

Assistant:

void rtosc::path_search(const rtosc::Ports& root,
                        const char *str, const char* needle,
                        char *types, std::size_t max_types,
                        rtosc_arg_t* args, std::size_t max_args,
                        path_search_opts opts, bool reply_with_query)
{
    using rtosc::Ports;
    using rtosc::Port;

    if(!needle)
        needle = "";

    // the last char of "types" is being used for a terminating 0
    std::size_t  max         = std::min(max_types - 1, max_args);
    size_t       pos         = 0;
    const Ports *ports       = nullptr;
    const Port  *single_port = nullptr;

    //zero out data
    memset(types, 0, max + 1);
    memset(args,  0, max);

    if(reply_with_query) {
        assert(max >= 2);
        types[pos]    = 's';
        args[pos++].s = str;
        types[pos]    = 's';
        args[pos++].s = needle;
    }

    if(!*str || !strcmp(str, "/")) {
        ports = &root;
    } else {
        const Port *port = root.apropos(str);
        //fprintf(stderr, "apropos %s -> %s\n",str,port?port->name:"<no result>");
        if(port) {
            if(port->ports) {
                ports = port->ports;
            } else {
                single_port = port;
            }
        }
    }

    const auto fn = [&pos,&needle,&types,&args,&max](const Port& p)
    {
#ifdef NDEBUG
        (void)max;
#else
        assert(pos < max);
#endif
        //fprintf(stderr, "path search iterating port: %s (needle %s) (pos %d)\n", p.name, needle, (int)pos);
        if(p.name && strstr(p.name, needle) == p.name)
        {
            types[pos]    = 's';
            args[pos++].s = p.name;
            types[pos]    = 'b';
            if(p.metadata && *p.metadata) {
                args[pos].b.data = (unsigned char*) p.metadata;
                auto tmp = rtosc::Port::MetaContainer(p.metadata);
                args[pos++].b.len  = tmp.length();
            } else {
                args[pos].b.data = (unsigned char*) NULL;
                args[pos++].b.len  = 0;
            }
        }
    };

    if(ports)
        for(const Port &p:*ports) fn(p);
    else if(single_port)
        fn(*single_port);

    if (opts == path_search_opts::sorted ||
        opts == path_search_opts::sorted_and_unique_prefix)
    {
        // we could use std::array, but its internal array does not necessarily
        // have offset 0
        using val_on_2 = my_array<rtosc_arg_t, 2>;
        using ptr_on_2 = val_on_2*;
        auto is_less = [](const val_on_2 &p1, const val_on_2 &p2) -> bool {
            return strcmp(p1[0].s, p2[0].s) < 0;
        };
        std::size_t n_paths_found = pos >> 1;
        std::sort((ptr_on_2)args, ((ptr_on_2)(args))+n_paths_found, is_less);

        if (opts == path_search_opts::sorted_and_unique_prefix)
        {
            std::size_t prev_pos = 0;
            std::size_t strlen_prev = n_paths_found > 1 ? strlen(args[prev_pos].s) : 0;
            std::size_t unused_paths = 0;
            for(pos = 2; pos < (n_paths_found<<1); ++++pos)
            {
                assert(args[prev_pos].s); // invariant

                // is the prev path a (real) sub-path of this path?
                // i.e. the current can be accessed by recursing into the prev?
                if(strlen_prev < strlen(args[pos].s) &&
                   0 == strncmp(args[pos].s, args[prev_pos].s, strlen_prev) &&
                   args[prev_pos].s[strlen_prev-1] == '/')
                {
                    // then mark this as unused
                    args[pos].s = nullptr;
                    ++unused_paths;
                }
                else
                {
                    prev_pos = pos;
                    strlen_prev = strlen(args[prev_pos].s);
                }
            }

            // another sort, only to move unused paths to the end
            auto is_less_2 = [](const val_on_2 &p1, const val_on_2 &p2) -> bool {
                return (!(p1[0].s)) ? false // move p1 to the end
                                    : (!(p2[0].s)) ? true // move p2 to the end
                                                   // is actually already sorted:
                                                   : (strcmp(p1[0].s, p2[0].s) < 0);
            };
            std::sort((ptr_on_2)args, ((ptr_on_2)(args))+n_paths_found, is_less_2);

            // cut off unused paths
            types[(n_paths_found - unused_paths)<<1] = 0;
        }
    }
}